

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O0

VRDisplayNode *
MinVR::VRHeadTrackingNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  VRAnyCoreType t;
  VRAnyCoreType t_00;
  VRAnyCoreType t_01;
  VRAnyCoreType t_02;
  bool bVar1;
  ostream *poVar2;
  VRDisplayNode *pVVar3;
  string *in_RDX;
  undefined8 *in_RDI;
  VRHeadTrackingNode *node;
  VRMatrix4 lookAtMatrix;
  VRMatrix4 M2;
  VRMatrix4 M1;
  VRVector3 y;
  VRVector3 x;
  VRVector3 z;
  VRVector3 center;
  VRVector3 eye;
  VRVector3 up;
  VRMatrix4 headMatrix;
  string trackingEvent;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  float in_stack_fffffffffffff810;
  float in_stack_fffffffffffff814;
  float in_stack_fffffffffffff818;
  float in_stack_fffffffffffff81c;
  float in_stack_fffffffffffff828;
  float in_stack_fffffffffffff82c;
  float in_stack_fffffffffffff830;
  float in_stack_fffffffffffff834;
  float in_stack_fffffffffffff838;
  float in_stack_fffffffffffff83c;
  float in_stack_fffffffffffff840;
  float in_stack_fffffffffffff844;
  char *in_stack_fffffffffffff848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff850;
  VRVector3 *in_stack_fffffffffffff858;
  undefined8 in_stack_fffffffffffff860;
  VRDisplayNode *pVVar4;
  undefined8 in_stack_fffffffffffff868;
  VRMatrix4 *in_stack_fffffffffffff870;
  VRMatrix4 *in_stack_fffffffffffff878;
  float r3c1;
  string *in_stack_fffffffffffff880;
  float r3c2;
  string *in_stack_fffffffffffff888;
  float r3c3;
  VRDataIndex *in_stack_fffffffffffff890;
  float in_stack_fffffffffffff898;
  float in_stack_fffffffffffff8a0;
  float r4c2;
  VRMatrix4 *in_stack_fffffffffffff8a8;
  float in_stack_fffffffffffff8b0;
  float in_stack_fffffffffffff8b4;
  float r4c4;
  string *in_stack_fffffffffffff8b8;
  VRHeadTrackingNode *in_stack_fffffffffffff8c0;
  VRMatrix4 *this;
  bool local_62a;
  undefined1 in_stack_fffffffffffffa67;
  string *in_stack_fffffffffffffa68;
  string *in_stack_fffffffffffffa70;
  VRDataIndex *in_stack_fffffffffffffa78;
  VRMatrix4 local_578;
  VRMatrix4 local_530;
  VRMatrix4 local_4e8;
  VRMatrix4 local_4a0;
  VRVector3 local_458;
  VRVector3 local_440;
  VRVector3 local_428;
  VRVector3 local_410;
  VRVector3 local_3f8;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [32];
  VRDatum_conflict *local_398;
  VRVector3 local_390;
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [32];
  VRDatum_conflict *local_330;
  VRVector3 local_328;
  string local_310 [39];
  allocator<char> local_2e9;
  string local_2e8 [32];
  VRDatum_conflict *local_2c8;
  VRVector3 local_2c0;
  byte local_2a1;
  string local_2a0 [37];
  byte local_27b;
  byte local_27a;
  allocator<char> local_279;
  string local_278 [39];
  byte local_251;
  string local_250 [37];
  byte local_22b;
  byte local_22a;
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [32];
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [32];
  VRDatum_conflict *local_178;
  VRMatrix4 local_170;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  VRMatrix4 local_e0;
  string local_98 [55];
  allocator<char> local_61;
  string local_60 [32];
  VRDatum_conflict *local_40;
  string local_38 [32];
  string *local_18;
  undefined8 *local_8;
  
  this = (VRMatrix4 *)&stack0xfffffffffffff808;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::__cxx11::string::string(local_98,local_18);
  local_40 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                        in_stack_fffffffffffffa68,(bool)in_stack_fffffffffffffa67);
  VRDatumConverter::operator_cast_to_string
            ((VRDatumConverter<MinVR::VRDatum> *)
             CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  VRMatrix4::VRMatrix4((VRMatrix4 *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
  std::__cxx11::string::string(local_128,local_18);
  bVar1 = VRDataIndex::exists(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                              in_stack_fffffffffffff880,
                              SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0));
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    std::__cxx11::string::string(local_1c0,local_18);
    local_178 = (VRDatum_conflict *)
                VRDataIndex::getValue
                          (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                           in_stack_fffffffffffffa68,(bool)in_stack_fffffffffffffa67);
    t.datum._4_4_ = in_stack_fffffffffffff834;
    t.datum._0_4_ = in_stack_fffffffffffff830;
    VRMatrix4::VRMatrix4
              ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),t);
    VRMatrix4::operator=
              ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
               (VRMatrix4 *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
    VRMatrix4::~VRMatrix4(&local_170);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
  }
  else {
    std::allocator<char>::allocator();
    local_22a = 0;
    local_22b = 0;
    local_251 = 0;
    local_27a = 0;
    local_27b = 0;
    local_2a1 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
    std::__cxx11::string::string(local_208,local_18);
    bVar1 = VRDataIndex::exists(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                                in_stack_fffffffffffff880,
                                SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0));
    local_62a = false;
    if (bVar1) {
      std::allocator<char>::allocator();
      local_22a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      local_22b = 1;
      std::__cxx11::string::string(local_250,local_18);
      local_251 = 1;
      bVar1 = VRDataIndex::exists(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                                  in_stack_fffffffffffff880,
                                  SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0));
      local_62a = false;
      if (bVar1) {
        std::allocator<char>::allocator();
        local_27a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840))
        ;
        local_27b = 1;
        std::__cxx11::string::string(local_2a0,local_18);
        local_2a1 = 1;
        local_62a = VRDataIndex::exists(in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                                        in_stack_fffffffffffff880,
                                        SUB81((ulong)in_stack_fffffffffffff878 >> 0x38,0));
      }
    }
    r3c3 = SUB84(in_stack_fffffffffffff890,0);
    r3c2 = SUB84(in_stack_fffffffffffff888,0);
    r3c1 = SUB84(in_stack_fffffffffffff880,0);
    if ((local_2a1 & 1) != 0) {
      std::__cxx11::string::~string(local_2a0);
    }
    if ((local_27b & 1) != 0) {
      std::__cxx11::string::~string(local_278);
    }
    if ((local_27a & 1) != 0) {
      std::allocator<char>::~allocator(&local_279);
    }
    if ((local_251 & 1) != 0) {
      std::__cxx11::string::~string(local_250);
    }
    if ((local_22b & 1) != 0) {
      std::__cxx11::string::~string(local_228);
    }
    if ((local_22a & 1) != 0) {
      std::allocator<char>::~allocator(&local_229);
    }
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    if (local_62a == false) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Warning : no HeadMatrix defined for ");
      poVar2 = std::operator<<(poVar2,local_18);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 "
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::allocator<char>::allocator();
      r4c4 = SUB84(in_stack_fffffffffffff8b8,0);
      r4c2 = SUB84(in_stack_fffffffffffff8a8,0);
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::__cxx11::string::string(local_310,local_18);
      local_2c8 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                             in_stack_fffffffffffffa68,(bool)in_stack_fffffffffffffa67);
      t_00.datum._4_4_ = in_stack_fffffffffffff834;
      t_00.datum._0_4_ = in_stack_fffffffffffff830;
      VRVector3::VRVector3
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),t_00);
      std::__cxx11::string::~string(local_310);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator(&local_2e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::__cxx11::string::string(local_378,local_18);
      local_330 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                             in_stack_fffffffffffffa68,(bool)in_stack_fffffffffffffa67);
      t_01.datum._4_4_ = in_stack_fffffffffffff834;
      t_01.datum._0_4_ = in_stack_fffffffffffff830;
      VRVector3::VRVector3
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),t_01);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string(local_350);
      std::allocator<char>::~allocator(&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff850,in_stack_fffffffffffff848,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffff844,in_stack_fffffffffffff840));
      std::__cxx11::string::string(local_3e0,local_18);
      local_398 = (VRDatum_conflict *)
                  VRDataIndex::getValue
                            (in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,
                             in_stack_fffffffffffffa68,(bool)in_stack_fffffffffffffa67);
      t_02.datum._4_4_ = in_stack_fffffffffffff834;
      t_02.datum._0_4_ = in_stack_fffffffffffff830;
      VRVector3::VRVector3
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff82c,in_stack_fffffffffffff828),t_02);
      std::__cxx11::string::~string(local_3e0);
      std::__cxx11::string::~string(local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      MinVR::operator-((VRVector3 *)CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818),
                       (VRVector3 *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810));
      VRVector3::normalize
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      VRVector3::operator=(&local_3f8,&local_410);
      VRVector3::~VRVector3(&local_410);
      VRVector3::cross(in_stack_fffffffffffff858,(VRVector3 *)in_stack_fffffffffffff850);
      VRVector3::normalize
                ((VRVector3 *)CONCAT44(in_stack_fffffffffffff83c,in_stack_fffffffffffff838));
      VRVector3::operator=(&local_428,&local_440);
      VRVector3::~VRVector3(&local_440);
      VRVector3::cross(in_stack_fffffffffffff858,(VRVector3 *)in_stack_fffffffffffff850);
      VRVector3::operator[](&local_428,0);
      VRVector3::operator[](&local_458,0);
      VRVector3::operator[](&local_3f8,0);
      VRVector3::operator[](&local_428,1);
      VRVector3::operator[](&local_458,1);
      VRVector3::operator[](&local_3f8,1);
      VRVector3::operator[](&local_428,2);
      VRVector3::operator[](&local_458,2);
      VRVector3::operator[](&local_3f8,2);
      VRMatrix4::fromRowMajorElements
                ((float)((ulong)in_stack_fffffffffffff868 >> 0x20),(float)in_stack_fffffffffffff868,
                 (float)((ulong)in_stack_fffffffffffff860 >> 0x20),(float)in_stack_fffffffffffff860,
                 (float)((ulong)in_stack_fffffffffffff858 >> 0x20),
                 SUB84(in_stack_fffffffffffff858,0),
                 (float)((ulong)in_stack_fffffffffffff850 >> 0x20),
                 SUB84(in_stack_fffffffffffff850,0),r3c1,r3c2,r3c3,in_stack_fffffffffffff898,
                 in_stack_fffffffffffff8a0,r4c2,in_stack_fffffffffffff8b0,r4c4);
      in_stack_fffffffffffff8c0 = (VRHeadTrackingNode *)VRVector3::operator[](&local_328,0);
      in_stack_fffffffffffff8b4 =
           -*(float *)&(in_stack_fffffffffffff8c0->super_VRDisplayNode)._vptr_VRDisplayNode;
      in_stack_fffffffffffff8b8 = (string *)VRVector3::operator[](&local_328,1);
      in_stack_fffffffffffff8a8 = (VRMatrix4 *)VRVector3::operator[](&local_328,2);
      in_stack_fffffffffffff810 = 0.0;
      in_stack_fffffffffffff808 = 0;
      VRMatrix4::fromRowMajorElements
                ((float)((ulong)in_stack_fffffffffffff868 >> 0x20),(float)in_stack_fffffffffffff868,
                 (float)((ulong)in_stack_fffffffffffff860 >> 0x20),(float)in_stack_fffffffffffff860,
                 (float)((ulong)in_stack_fffffffffffff858 >> 0x20),
                 SUB84(in_stack_fffffffffffff858,0),
                 (float)((ulong)in_stack_fffffffffffff850 >> 0x20),
                 SUB84(in_stack_fffffffffffff850,0),r3c1,r3c2,r3c3,SUB84(&stack0xfffffffffffff808,0)
                 ,in_stack_fffffffffffff8a0,SUB84(in_stack_fffffffffffff8a8,0),
                 in_stack_fffffffffffff8b0,SUB84(in_stack_fffffffffffff8b8,0));
      MinVR::operator*(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      VRMatrix4::inverse(this);
      VRMatrix4::operator=
                ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
                 (VRMatrix4 *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
      VRMatrix4::~VRMatrix4(&local_578);
      VRMatrix4::~VRMatrix4(&local_530);
      VRMatrix4::~VRMatrix4(&local_4e8);
      VRMatrix4::~VRMatrix4(&local_4a0);
      VRVector3::~VRVector3(&local_458);
      VRVector3::~VRVector3(&local_428);
      VRVector3::~VRVector3(&local_3f8);
      VRVector3::~VRVector3(&local_390);
      VRVector3::~VRVector3(&local_328);
      VRVector3::~VRVector3(&local_2c0);
    }
  }
  pVVar3 = (VRDisplayNode *)operator_new(0xe0);
  VRMatrix4::VRMatrix4
            ((VRMatrix4 *)CONCAT44(in_stack_fffffffffffff814,in_stack_fffffffffffff810),
             (VRMatrix4 *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808));
  VRHeadTrackingNode(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                     (string *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                     in_stack_fffffffffffff8a8);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffa38);
  pVVar4 = (VRDisplayNode *)0x0;
  if (pVVar3 != (VRDisplayNode *)0x0) {
    pVVar4 = pVVar3 + 1;
  }
  (**(code **)*local_8)(local_8,pVVar4);
  VRMatrix4::~VRMatrix4(&local_e0);
  std::__cxx11::string::~string(local_38);
  return pVVar3;
}

Assistant:

VRDisplayNode* VRHeadTrackingNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace) {

	std::string trackingEvent = config->getValue("HeadTrackingEvent", nameSpace);
	VRMatrix4 headMatrix;

	if (config->exists("HeadMatrix", nameSpace)){
		headMatrix = config->getValue("HeadMatrix", nameSpace);
	}
	else if (config->exists("LookAtUp", nameSpace) && config->exists("LookAtEye", nameSpace) && config->exists("LookAtCenter", nameSpace))
	{
		VRVector3 up = config->getValue("LookAtUp", nameSpace);
		VRVector3 eye = config->getValue("LookAtEye", nameSpace);
		VRVector3 center = config->getValue("LookAtCenter", nameSpace);

        VRVector3 z = eye - center;
		z = z.normalize();
		VRVector3 x = up.cross(z);
		x = x.normalize();
		VRVector3 y = z.cross(x);

        VRMatrix4 M1 = VRMatrix4::fromRowMajorElements(x[0], y[0], z[0], 0,
                                                       x[1], y[1], z[1], 0,
                                                       x[2], y[2], z[2], 0,
                                                       0, 0, 0, 1);

        VRMatrix4 M2 = VRMatrix4::fromRowMajorElements(1, 0, 0, -eye[0],
                                                       0, 1, 0, -eye[1],
                                                       0, 0, 1, -eye[2],
                                                       0, 0, 0, 1);

		VRMatrix4 lookAtMatrix = M1 * M2;
        headMatrix = lookAtMatrix.inverse();
	}
	else
	{
		std::cerr << "Warning : no HeadMatrix defined for " << nameSpace << std::endl;
		std::cerr << "Either Define HeadMatrix or LookAtUp, LookAtEye and LookAtCenter" << std::endl;
		std::cerr << "Using IdentityMatrix as default 1,0,0,0, 0,1,0,0, 0,0,1,0, 0,0,0,1 " << std::endl;
	}

	VRHeadTrackingNode *node = new VRHeadTrackingNode(nameSpace, trackingEvent, headMatrix);

	vrMain->addEventHandler(node);

	return node;
}